

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O3

void __thiscall
Assimp::Collada::Animation::CombineSingleChannelAnimationsRecursively
          (Animation *this,Animation *pParent)

{
  _Rb_tree_header *p_Var1;
  Animation *pAVar2;
  pointer __k;
  pointer __dest;
  bool bVar3;
  iterator iVar4;
  pointer ppAVar5;
  pointer ppAVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  childrenTargets;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppAVar6 = (pParent->mSubAnims).
            super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (ppAVar6 !=
      (pParent->mSubAnims).
      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = true;
    do {
      pAVar2 = *ppAVar6;
      CombineSingleChannelAnimationsRecursively(this,pAVar2);
      if ((bVar3) &&
         (__k = (pAVar2->mChannels).
                super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                ._M_impl.super__Vector_impl_data._M_start,
         (long)(pAVar2->mChannels).
               super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)__k == 0xc0)) {
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_60,&__k->mTarget);
        if ((_Rb_tree_header *)iVar4._M_node != p_Var1) goto LAB_0042efe2;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,
                   &((pAVar2->mChannels).
                     super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                     ._M_impl.super__Vector_impl_data._M_start)->mTarget);
      }
      else {
LAB_0042efe2:
        bVar3 = false;
      }
      ppAVar6 = ppAVar6 + 1;
    } while (ppAVar6 !=
             (pParent->mSubAnims).
             super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (!bVar3) goto LAB_0042f066;
  }
  __dest = (pParent->mSubAnims).
           super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (__dest != ppAVar6) {
    ppAVar6 = __dest + 1;
    do {
      pAVar2 = *__dest;
      std::
      vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
      ::push_back(&pParent->mChannels,
                  (pAVar2->mChannels).
                  super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                  ._M_impl.super__Vector_impl_data._M_start);
      ppAVar5 = (pParent->mSubAnims).
                super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppAVar6 != ppAVar5) {
        memmove(__dest,ppAVar6,(long)ppAVar5 - (long)ppAVar6);
        ppAVar5 = (pParent->mSubAnims).
                  super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      (pParent->mSubAnims).
      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppAVar5 + -1;
      ~Animation(pAVar2);
      operator_delete(pAVar2,0x50);
    } while (__dest != (pParent->mSubAnims).
                       super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
LAB_0042f066:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void CombineSingleChannelAnimationsRecursively(Animation *pParent)
	{
		std::set<std::string> childrenTargets;
		bool childrenAnimationsHaveDifferentChannels = true;

		for (std::vector<Animation*>::iterator it = pParent->mSubAnims.begin(); it != pParent->mSubAnims.end();)
		{
			Animation *anim = *it;
			CombineSingleChannelAnimationsRecursively(anim);

			if (childrenAnimationsHaveDifferentChannels && anim->mChannels.size() == 1 &&
				childrenTargets.find(anim->mChannels[0].mTarget) == childrenTargets.end()) {
				childrenTargets.insert(anim->mChannels[0].mTarget);
			} else {
				childrenAnimationsHaveDifferentChannels = false;
			}

			++it;
		}

		// We only want to combine animations if they have different channels
		if (childrenAnimationsHaveDifferentChannels)
		{
			for (std::vector<Animation*>::iterator it = pParent->mSubAnims.begin(); it != pParent->mSubAnims.end();)
			{
				Animation *anim = *it;

				pParent->mChannels.push_back(anim->mChannels[0]);

				it = pParent->mSubAnims.erase(it);

				delete anim;
				continue;
			}
		}
	}